

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void test_exhaustive_ecmult_multi(secp256k1_context *ctx,secp256k1_ge *group)

{
  int iVar1;
  long in_RSI;
  ecmult_multi_data data;
  secp256k1_scalar g_sc;
  secp256k1_gej tmp;
  secp256k1_scratch *scratch;
  uint64_t iter;
  int y;
  int x;
  int k;
  int j;
  int i;
  secp256k1_scratch *in_stack_fffffffffffffe48;
  uint v;
  secp256k1_callback *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  secp256k1_callback *in_stack_fffffffffffffe60;
  undefined1 auStack_140 [24];
  secp256k1_ge *in_stack_fffffffffffffed8;
  secp256k1_gej *in_stack_fffffffffffffee0;
  void *in_stack_ffffffffffffff40;
  secp256k1_ecmult_multi_callback *in_stack_ffffffffffffff48;
  secp256k1_scalar *in_stack_ffffffffffffff50;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_scratch *in_stack_ffffffffffffff60;
  secp256k1_callback *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff80;
  uint64_t local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_30 = 0;
  local_10 = in_RSI;
  secp256k1_scratch_create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_14 = 0;
  do {
    if (0xc < local_14) {
      secp256k1_scratch_destroy(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      return;
    }
    for (local_18 = 0; local_18 < 0xd; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 0xd; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < 0xd; local_20 = local_20 + 1) {
          iVar1 = skip_section(&local_30);
          if (iVar1 == 0) {
            for (local_24 = 0; local_24 < 0xd; local_24 = local_24 + 1) {
              secp256k1_scalar_set_int
                        ((secp256k1_scalar *)in_stack_fffffffffffffe50,
                         (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20));
              v = (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20);
              secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_fffffffffffffe50,v);
              secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_fffffffffffffe50,v);
              memcpy(&stack0xfffffffffffffe58,(void *)(local_10 + (long)local_20 * 0x68),0x68);
              memcpy(auStack_140,(void *)(local_10 + (long)local_24 * 0x68),0x68);
              in_stack_fffffffffffffe48 = (secp256k1_scratch *)0x2;
              secp256k1_ecmult_multi_var
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff80);
              iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
              if (iVar1 == 0) {
                fprintf(_stderr,"%s:%d: %s\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests_exhaustive.c"
                        ,0xd9,
                        "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i * x + j * y + k) % EXHAUSTIVE_TEST_ORDER])"
                       );
                abort();
              }
            }
          }
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static void test_exhaustive_ecmult_multi(const secp256k1_context *ctx, const secp256k1_ge *group) {
    int i, j, k, x, y;
    uint64_t iter = 0;
    secp256k1_scratch *scratch = secp256k1_scratch_create(&ctx->error_callback, 4096);
    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
        for (j = 0; j < EXHAUSTIVE_TEST_ORDER; j++) {
            for (k = 0; k < EXHAUSTIVE_TEST_ORDER; k++) {
                for (x = 0; x < EXHAUSTIVE_TEST_ORDER; x++) {
                    if (skip_section(&iter)) continue;
                    for (y = 0; y < EXHAUSTIVE_TEST_ORDER; y++) {
                        secp256k1_gej tmp;
                        secp256k1_scalar g_sc;
                        ecmult_multi_data data;

                        secp256k1_scalar_set_int(&data.sc[0], i);
                        secp256k1_scalar_set_int(&data.sc[1], j);
                        secp256k1_scalar_set_int(&g_sc, k);
                        data.pt[0] = group[x];
                        data.pt[1] = group[y];

                        secp256k1_ecmult_multi_var(&ctx->error_callback, scratch, &tmp, &g_sc, ecmult_multi_callback, &data, 2);
                        CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(i * x + j * y + k) % EXHAUSTIVE_TEST_ORDER]));
                    }
                }
            }
        }
    }
    secp256k1_scratch_destroy(&ctx->error_callback, scratch);
}